

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

int __thiscall
Centaurus::CATNMachine<char>::add_node
          (CATNMachine<char> *this,CATNNode<char> *node,int origin,int tag)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  CharClass<char> local_40;
  int local_20;
  int local_1c;
  int tag_local;
  int origin_local;
  CATNNode<char> *node_local;
  CATNMachine<char> *this_local;
  
  local_20 = tag;
  local_1c = origin;
  _tag_local = node;
  node_local = (CATNNode<char> *)this;
  bVar1 = std::vector<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>::empty
                    (&this->m_nodes);
  if ((!bVar1) && (-1 < local_1c)) {
    this_00 = std::vector<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>::
              operator[](&this->m_nodes,(long)local_1c);
    CharClass<char>::CharClass(&local_40);
    sVar2 = std::vector<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>::
            size(&this->m_nodes);
    CATNNode<char>::add_transition(this_00,&local_40,(int)sVar2,local_20);
    CharClass<char>::~CharClass(&local_40);
  }
  std::vector<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>::push_back
            (&this->m_nodes,_tag_local);
  sVar2 = std::vector<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>::size
                    (&this->m_nodes);
  return (int)sVar2 + -1;
}

Assistant:

int add_node(const CATNNode<TCHAR>& node, int origin, int tag)
    {
        if (!m_nodes.empty() && origin >= 0)
            m_nodes[origin].add_transition(CharClass<TCHAR>(), m_nodes.size(), tag);
        m_nodes.push_back(node);
        return m_nodes.size() - 1;
    }